

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncryptionOptions.h
# Opt level: O1

void __thiscall
EncryptionOptions::EncryptionOptions
          (EncryptionOptions *this,string *inUserPassword,longlong inUserProtectionOptionsFlag,
          string *inOwnerPassword)

{
  (this->UserPassword)._M_dataplus._M_p = (pointer)&(this->UserPassword).field_2;
  (this->UserPassword)._M_string_length = 0;
  (this->UserPassword).field_2._M_local_buf[0] = '\0';
  (this->OwnerPassword)._M_dataplus._M_p = (pointer)&(this->OwnerPassword).field_2;
  (this->OwnerPassword)._M_string_length = 0;
  (this->OwnerPassword).field_2._M_local_buf[0] = '\0';
  this->ShouldEncrypt = true;
  std::__cxx11::string::_M_assign((string *)&this->UserPassword);
  this->UserProtectionOptionsFlag = inUserProtectionOptionsFlag;
  std::__cxx11::string::_M_assign((string *)&this->OwnerPassword);
  return;
}

Assistant:

EncryptionOptions(const std::string& inUserPassword,
					long long inUserProtectionOptionsFlag,
					const std::string& inOwnerPassword) {
		ShouldEncrypt = true;
		UserPassword = inUserPassword;
		UserProtectionOptionsFlag = inUserProtectionOptionsFlag;
		OwnerPassword = inOwnerPassword;
	}